

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O1

int mbedtls_asn1_get_len(uchar **p,uchar *end,size_t *len)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  
  pbVar3 = *p;
  lVar4 = (long)end - (long)pbVar3;
  if (lVar4 < 1) {
    return -0x60;
  }
  if ((char)*pbVar3 < '\0') {
    switch(*pbVar3 & 0x7f) {
    case 1:
      if (lVar4 == 1) {
        return -0x60;
      }
      *len = (ulong)pbVar3[1];
      pbVar3 = pbVar3 + 2;
      break;
    case 2:
      if (lVar4 < 3) {
        return -0x60;
      }
      *len = (ulong)(ushort)(*(ushort *)(pbVar3 + 1) << 8 | *(ushort *)(pbVar3 + 1) >> 8);
      pbVar3 = pbVar3 + 3;
      break;
    case 3:
      if (lVar4 < 4) {
        return -0x60;
      }
      *len = (ulong)pbVar3[3] | (ulong)((uint)pbVar3[2] << 8 | (uint)pbVar3[1] << 0x10);
      pbVar3 = pbVar3 + 4;
      break;
    case 4:
      if (lVar4 < 5) {
        return -0x60;
      }
      uVar1 = *(uint *)(pbVar3 + 1);
      *len = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
                    );
      pbVar3 = pbVar3 + 5;
      break;
    default:
      return -100;
    }
    *p = pbVar3;
  }
  else {
    *p = pbVar3 + 1;
    *len = (ulong)*pbVar3;
  }
  iVar2 = -0x60;
  if (*len <= (ulong)((long)end - (long)*p)) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_len( unsigned char **p,
                  const unsigned char *end,
                  size_t *len )
{
    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    if( ( **p & 0x80 ) == 0 )
        *len = *(*p)++;
    else
    {
        switch( **p & 0x7F )
        {
        case 1:
            if( ( end - *p ) < 2 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = (*p)[1];
            (*p) += 2;
            break;

        case 2:
            if( ( end - *p ) < 3 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = ( (size_t)(*p)[1] << 8 ) | (*p)[2];
            (*p) += 3;
            break;

        case 3:
            if( ( end - *p ) < 4 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = ( (size_t)(*p)[1] << 16 ) |
                   ( (size_t)(*p)[2] << 8  ) | (*p)[3];
            (*p) += 4;
            break;

        case 4:
            if( ( end - *p ) < 5 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = ( (size_t)(*p)[1] << 24 ) | ( (size_t)(*p)[2] << 16 ) |
                   ( (size_t)(*p)[3] << 8  ) |           (*p)[4];
            (*p) += 5;
            break;

        default:
            return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );
        }
    }

    if( *len > (size_t) ( end - *p ) )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    return( 0 );
}